

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_socket.c
# Opt level: O3

ares_conn_err_t ares_socket_deref_error(int err)

{
  switch(err) {
  case 0x61:
    return ARES_CONN_ERR_AFNOSUPPORT;
  case 0x62:
  case 0x66:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x72:
    return ARES_CONN_ERR_FAILURE;
  case 99:
    return ARES_CONN_ERR_BADADDR;
  case 100:
    return ARES_CONN_ERR_NETDOWN;
  case 0x65:
    return ARES_CONN_ERR_NETUNREACH;
  case 0x67:
    return ARES_CONN_ERR_CONNABORTED;
  case 0x68:
    return ARES_CONN_ERR_CONNRESET;
  case 0x6e:
    return ARES_CONN_ERR_CONNTIMEDOUT;
  case 0x6f:
    return ARES_CONN_ERR_CONNREFUSED;
  case 0x70:
    return ARES_CONN_ERR_HOSTDOWN;
  case 0x71:
    return ARES_CONN_ERR_HOSTUNREACH;
  case 0x73:
    return ARES_CONN_ERR_WOULDBLOCK;
  }
  if (err != 4) {
    if (err != 0xb) {
      return ARES_CONN_ERR_FAILURE;
    }
    return ARES_CONN_ERR_WOULDBLOCK;
  }
  return ARES_CONN_ERR_INTERRUPT;
}

Assistant:

static ares_conn_err_t ares_socket_deref_error(int err)
{
  switch (err) {
#if defined(EWOULDBLOCK)
    case EWOULDBLOCK:
      return ARES_CONN_ERR_WOULDBLOCK;
#endif
#if defined(EAGAIN) && (!defined(EWOULDBLOCK) || EAGAIN != EWOULDBLOCK)
    case EAGAIN:
      return ARES_CONN_ERR_WOULDBLOCK;
#endif
    case EINPROGRESS:
      return ARES_CONN_ERR_WOULDBLOCK;
    case ENETDOWN:
      return ARES_CONN_ERR_NETDOWN;
    case ENETUNREACH:
      return ARES_CONN_ERR_NETUNREACH;
    case ECONNABORTED:
      return ARES_CONN_ERR_CONNABORTED;
    case ECONNRESET:
      return ARES_CONN_ERR_CONNRESET;
    case ECONNREFUSED:
      return ARES_CONN_ERR_CONNREFUSED;
    case ETIMEDOUT:
      return ARES_CONN_ERR_CONNTIMEDOUT;
    case EHOSTDOWN:
      return ARES_CONN_ERR_HOSTDOWN;
    case EHOSTUNREACH:
      return ARES_CONN_ERR_HOSTUNREACH;
    case EINTR:
      return ARES_CONN_ERR_INTERRUPT;
    case EAFNOSUPPORT:
      return ARES_CONN_ERR_AFNOSUPPORT;
    case EADDRNOTAVAIL:
      return ARES_CONN_ERR_BADADDR;
    default:
      break;
  }

  return ARES_CONN_ERR_FAILURE;
}